

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadContext.cpp
# Opt level: O1

InterpreterStackFrame * __thiscall ThreadContext::PopInterpreterFrame(ThreadContext *this)

{
  InterpreterStackFrame *pIVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  
  pIVar1 = this->leafInterpreterFrame;
  if (pIVar1 == (InterpreterStackFrame *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ThreadContext.cpp"
                       ,0x76f,"(interpreterFrame)","interpreterFrame");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  this->leafInterpreterFrame = *(InterpreterStackFrame **)(pIVar1 + 0xa8);
  return pIVar1;
}

Assistant:

Js::InterpreterStackFrame *
ThreadContext::PopInterpreterFrame()
{
    Js::InterpreterStackFrame *interpreterFrame = this->leafInterpreterFrame;
    Assert(interpreterFrame);
    this->leafInterpreterFrame = interpreterFrame->GetPreviousFrame();
    return interpreterFrame;
}